

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O2

void Sbd_ManSolveSelect(Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vDivVars,
                       Vec_Int_t *vDivValues,Vec_Int_t *vWinObjs,Vec_Int_t *vObj2Var,Vec_Int_t *vTfo
                       ,Vec_Int_t *vRoots)

{
  int iVar1;
  Vec_Int_t *vSop;
  Vec_Int_t *vTemp;
  sat_solver *pSat;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int nVars;
  int pInds [64];
  
  vSop = Vec_IntAlloc(100);
  vTemp = Vec_IntAlloc(100);
  uVar4 = 0;
  pSat = Sbd_ManSatSolver((sat_solver *)0x0,p,vMirrors,Pivot,vWinObjs,vObj2Var,vTfo,vRoots,0);
  iVar1 = Vec_IntEntry(vObj2Var,Pivot);
  iVar1 = Sbd_ManSolve2(pSat,iVar1,vTfo->nSize + vWinObjs->nSize + vRoots->nSize,vDivVars,vDivValues
                        ,vTemp,vSop);
  printf("Pivot = %4d. Divs = %4d.  ",(ulong)(uint)Pivot,(ulong)(uint)vDivVars->nSize);
  if (iVar1 == 0) {
    puts("UNSAT.");
  }
  else {
    Sbd_ManSolverSupp(vSop,pInds,&nVars);
    uVar2 = (ulong)(uint)vSop->nSize;
    if (vSop->nSize < 1) {
      uVar2 = uVar4;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uVar4 = (ulong)((int)uVar4 + (uint)(vSop->pArray[uVar3] == -1));
    }
    printf("SAT with %d vars and %d cubes.\n",(ulong)(uint)nVars,uVar4);
  }
  Vec_IntFree(vTemp);
  Vec_IntFree(vSop);
  sat_solver_delete(pSat);
  return;
}

Assistant:

void Sbd_ManSolveSelect( Gia_Man_t * p, Vec_Int_t * vMirrors, int Pivot, Vec_Int_t * vDivVars, Vec_Int_t * vDivValues, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, Vec_Int_t * vTfo, Vec_Int_t * vRoots )
{
    Vec_Int_t * vSop = Vec_IntAlloc( 100 );
    Vec_Int_t * vTemp = Vec_IntAlloc( 100 );
    sat_solver * pSat = Sbd_ManSatSolver( NULL, p, vMirrors, Pivot, vWinObjs, vObj2Var, vTfo, vRoots, 0 );
    int PivotVar = Vec_IntEntry(vObj2Var, Pivot);
    int FreeVar = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    int Status = Sbd_ManSolve2( pSat, PivotVar, FreeVar, vDivVars, vDivValues, vTemp, vSop );
    printf( "Pivot = %4d. Divs = %4d.  ", Pivot, Vec_IntSize(vDivVars) );
    if ( Status == 0 )
        printf( "UNSAT.\n" );
    else
    {
        int nVars, pInds[64];
        word Supp = Sbd_ManSolverSupp( vSop, pInds, &nVars );
        //Sbd_ManSolverPrint( vSop );
        printf( "SAT with %d vars and %d cubes.\n", nVars, Vec_IntCountEntry(vSop, -1) );
        Supp = 0;
    }
    Vec_IntFree( vTemp );
    Vec_IntFree( vSop );
    sat_solver_delete( pSat );
}